

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O1

void __thiscall
axl::sl::
ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
::moveToHead(ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
             *this,Iterator it)

{
  ListLink *pLVar1;
  size_t sVar2;
  ViewEntry *pVVar3;
  ListLink *pLVar4;
  
  pVVar3 = *(ViewEntry **)
            it.
            super_IteratorImpl<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
            .
            super_IteratorBase<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
            .m_p;
  pLVar1 = *(ListLink **)
            ((long)it.
                   super_IteratorImpl<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
                   .
                   super_IteratorBase<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
                   .m_p + 8);
  pLVar4 = pLVar1;
  if (pLVar1 == (ListLink *)0x0) {
    pLVar4 = (ListLink *)this;
  }
  ((ListData<axl::io::MappedViewMgr::ViewEntry> *)&pLVar4->m_next)->m_head = pVVar3;
  if (pVVar3 == (ViewEntry *)0x0) {
    pVVar3 = (ViewEntry *)this;
  }
  (pVVar3->super_ListLink).m_prev = pLVar1;
  pVVar3 = (this->super_ListData<axl::io::MappedViewMgr::ViewEntry>).m_head;
  sVar2 = (this->super_ListData<axl::io::MappedViewMgr::ViewEntry>).m_count;
  (this->super_ListData<axl::io::MappedViewMgr::ViewEntry>).m_count = sVar2 - 1;
  *(undefined8 *)
   ((long)it.
          super_IteratorImpl<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
          .
          super_IteratorBase<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
          .m_p + 8) = 0;
  *(ViewEntry **)
   it.
   super_IteratorImpl<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
   .
   super_IteratorBase<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
   .m_p = pVVar3;
  if (pVVar3 == (ViewEntry *)0x0) {
    pVVar3 = (ViewEntry *)this;
  }
  ((ListData<axl::io::MappedViewMgr::ViewEntry> *)&pVVar3->super_ListLink)->m_tail =
       (ViewEntry *)
       it.
       super_IteratorImpl<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
       .
       super_IteratorBase<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
       .m_p;
  (this->super_ListData<axl::io::MappedViewMgr::ViewEntry>).m_head =
       (ViewEntry *)
       it.
       super_IteratorImpl<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
       .
       super_IteratorBase<axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>
       .m_p;
  (this->super_ListData<axl::io::MappedViewMgr::ViewEntry>).m_count = sVar2;
  return;
}

Assistant:

T*
	remove(Iterator it) {
		ASSERT(!isEmpty());

		ListLink* link = it.getLink();
		ListLink* next = link->m_next;
		ListLink* prev = link->m_prev;

		if (prev)
			prev->m_next = next;
		else
			this->m_head = Iterator::getEntryFromLink(next);

		if (next)
			next->m_prev = prev;
		else
			this->m_tail = Iterator::getEntryFromLink(prev);

		this->m_count--;
		return it.getEntry();
	}